

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O3

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::TPZDohrMatrix
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this,
          TPZAutoPointer<TPZDohrAssembly<double>_> *assembly)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrMatrix_019e8340;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->fNumThreads = 0;
  pTVar2 = assembly->fRef;
  (this->fAssembly).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

TPZDohrMatrix<TVar,TSubStruct>::TPZDohrMatrix(TPZAutoPointer<TPZDohrAssembly<TVar> > assembly)
: TPZMatrix<TVar>(), fNumThreads(0), fAssembly(assembly)
{
}